

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef narrow_stripov(jit_State *J,TRef tr,int lastop,IRRef mode)

{
  byte bVar1;
  uint lastop_00;
  TRef TVar2;
  TRef TVar3;
  jit_State *J_00;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  jit_State *in_RDI;
  IRRef op2;
  IRRef op1;
  BPropEntry *bp;
  int op;
  IRIns *ir;
  IRRef ref;
  jit_State *in_stack_ffffffffffffffa8;
  IRIns *pIVar4;
  IRRef1 key;
  TRef local_24;
  IRRef mode_00;
  
  lastop_00 = in_ESI & 0xffff;
  pIVar4 = (in_RDI->cur).ir + lastop_00;
  bVar1 = (pIVar4->field_1).o;
  if ((bVar1 < 0x35) || (in_EDX < (int)(uint)bVar1)) {
    local_24 = in_ESI;
    if (((in_ECX & 0x800) != 0) && ((0x604208U >> ((pIVar4->field_1).t.irt & 0x1f) & 1) == 0)) {
      (in_RDI->fold).ins.field_0.ot = 0x5515;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)in_ECX;
      local_24 = lj_opt_fold(in_stack_ffffffffffffffa8);
    }
  }
  else {
    J_00 = (jit_State *)narrow_bpc_get(in_RDI,(IRRef1)in_ESI,in_ECX);
    mode_00 = (IRRef)((ulong)pIVar4 >> 0x20);
    if (J_00 == (jit_State *)0x0) {
      TVar2 = narrow_stripov((jit_State *)CONCAT44(in_ESI,in_EDX),in_ECX,lastop_00,mode_00);
      TVar3 = narrow_stripov((jit_State *)CONCAT44(in_ESI,in_EDX),in_ECX,lastop_00,mode_00);
      key = (IRRef1)lastop_00;
      (in_RDI->fold).ins.field_0.ot = (bVar1 - 0xd) * 0x100 | (ushort)((in_ECX & 0x3e0) >> 5);
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
      local_24 = lj_opt_fold(J_00);
      narrow_bpc_set(in_RDI,key,(IRRef1)local_24,in_ECX);
    }
    else {
      local_24 = (uint)*(IRRef1 *)((long)&(J_00->cur).nextgc.gcptr32 + 2) +
                 (uint)*(byte *)((long)(in_RDI->cur).ir +
                                (ulong)*(IRRef1 *)((long)&(J_00->cur).nextgc.gcptr32 + 2) * 8 + 4) *
                 0x1000000;
    }
  }
  return local_24;
}

Assistant:

static TRef narrow_stripov(jit_State *J, TRef tr, int lastop, IRRef mode)
{
  IRRef ref = tref_ref(tr);
  IRIns *ir = IR(ref);
  int op = ir->o;
  if (op >= IR_ADDOV && op <= lastop) {
    BPropEntry *bp = narrow_bpc_get(J, ref, mode);
    if (bp) {
      return TREF(bp->val, irt_t(IR(bp->val)->t));
    } else {
      IRRef op1 = ir->op1, op2 = ir->op2;  /* The IR may be reallocated. */
      op1 = narrow_stripov(J, op1, lastop, mode);
      op2 = narrow_stripov(J, op2, lastop, mode);
      tr = emitir(IRT(op - IR_ADDOV + IR_ADD,
		      ((mode & IRCONV_DSTMASK) >> IRCONV_DSH)), op1, op2);
      narrow_bpc_set(J, ref, tref_ref(tr), mode);
    }
  } else if (LJ_64 && (mode & IRCONV_SEXT) && !irt_is64(ir->t)) {
    tr = emitir(IRT(IR_CONV, IRT_INTP), tr, mode);
  }
  return tr;
}